

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

int ConvolutionReverb::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float *pfVar1;
  UnityComplexNumber *pUVar2;
  UnityComplexNumber *pUVar3;
  UnityComplexNumber *pUVar4;
  uint uVar5;
  int iVar6;
  EffectData *data_00;
  Channel *pCVar7;
  long lVar8;
  int local_b0;
  float input;
  int n_3;
  int n_2;
  UnityComplexNumber *x_1;
  UnityComplexNumber *h;
  int k;
  UnityComplexNumber *y;
  int local_74;
  int n_1;
  UnityComplexNumber *x;
  int n;
  int mask;
  float *s;
  Channel *c;
  int i;
  int writeoffset;
  MutexScopeLock mutexScope1;
  float gain;
  float wet;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  data_00 = UnityAudioEffectState::GetEffectData<ConvolutionReverb::EffectData>(state);
  mutexScope1.mutex._4_4_ = data_00->p[0] * 0.01;
  mutexScope1.mutex._0_4_ = powf(10.0,data_00->p[1] * 0.05);
  SetupImpulse(data_00,outchannels,length,(state->field_0).field_0.samplerate);
  MutexScopeLock::MutexScopeLock((MutexScopeLock *)&i,data_00->mutex,true);
  for (c._0_4_ = 0; (int)c < inchannels; c._0_4_ = (int)c + 1) {
    pCVar7 = data_00->channels + (int)c;
    pfVar1 = pCVar7->s;
    uVar5 = data_00->fftsize - 1;
    c._4_4_ = data_00->writeoffset;
    for (x._0_4_ = 0; (int)x < data_00->hopsize; x._0_4_ = (int)x + 1) {
      pfVar1[(int)c._4_4_] = inbuffer[(int)x * inchannels + (int)c];
      c._4_4_ = c._4_4_ + 1 & uVar5;
    }
    c._4_4_ = data_00->writeoffset;
    pUVar2 = pCVar7->x[data_00->bufferindex];
    for (local_74 = 0; local_74 < data_00->fftsize; local_74 = local_74 + 1) {
      UnityComplexNumberT<float>::Set(pUVar2 + local_74,pfVar1[(int)c._4_4_],0.0);
      c._4_4_ = c._4_4_ + 1 & uVar5;
    }
    FFT::Forward(pUVar2,data_00->fftsize,false);
    c._4_4_ = c._4_4_ + data_00->hopsize & uVar5;
    pUVar2 = data_00->tmpoutput;
    memset(pUVar2,0,(long)data_00->fftsize << 3);
    for (h._4_4_ = 0; h._4_4_ < data_00->numpartitions; h._4_4_ = h._4_4_ + 1) {
      pUVar3 = pCVar7->h[h._4_4_];
      pUVar4 = pCVar7->x[(h._4_4_ + data_00->bufferindex) % data_00->numpartitions];
      for (input = 0.0; (int)input < data_00->fftsize; input = (float)((int)input + 1)) {
        lVar8 = (long)(int)input;
        UnityComplexNumberT<float>::MulAdd<float,float,float>
                  (pUVar3 + lVar8,pUVar4 + lVar8,pUVar2 + lVar8,pUVar2 + lVar8);
      }
    }
    FFT::Backward(pUVar2,data_00->fftsize,false);
    for (local_b0 = 0; local_b0 < data_00->hopsize; local_b0 = local_b0 + 1) {
      outbuffer[local_b0 * outchannels + (int)c] =
           (mutexScope1.mutex._0_4_ * pUVar2[local_b0].re +
           -inbuffer[local_b0 * outchannels + (int)c]) * mutexScope1.mutex._4_4_ +
           inbuffer[local_b0 * outchannels + (int)c];
    }
  }
  iVar6 = data_00->bufferindex + -1;
  data_00->bufferindex = iVar6;
  if (iVar6 < 0) {
    data_00->bufferindex = data_00->numpartitions + -1;
  }
  data_00->writeoffset = c._4_4_;
  MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&i);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const float wet = data->p[P_WET] * 0.01f;
        const float gain = powf(10.0f, 0.05f * data->p[P_GAIN]);

        // this should be done on a separate thread to avoid cpu spikes
        SetupImpulse(data, outchannels, (int)length, state->samplerate);

        // Lock data here in case float parameters are changed in pause/stopped mode and cause further calls to SetupImpulse
        MutexScopeLock mutexScope1(*data->mutex);

        int writeoffset; // set inside loop

        for (int i = 0; i < inchannels; i++)
        {
            Channel& c = data->channels[i];

            // feed new data to input buffer s
            float* s = c.s;
            const int mask = data->fftsize - 1;
            writeoffset = data->writeoffset;
            for (int n = 0; n < data->hopsize; n++)
            {
                s[writeoffset] = inbuffer[n * inchannels + i];
                writeoffset = (writeoffset + 1) & mask;
            }

            // calculate X=FFT(s)
            writeoffset = data->writeoffset;
            UnityComplexNumber* x = c.x[data->bufferindex];
            for (int n = 0; n < data->fftsize; n++)
            {
                x[n].Set(s[writeoffset], 0.0f);
                writeoffset = (writeoffset + 1) & mask;
            }
            FFT::Forward(x, data->fftsize, false);

            writeoffset = (writeoffset + data->hopsize) & mask;

            // calculate y=IFFT(sum(convolve(H_k, X_k), k=1..numpartitions))
            UnityComplexNumber* y = data->tmpoutput;
            memset(y, 0, sizeof(UnityComplexNumber) * data->fftsize);
            for (int k = 0; k < data->numpartitions; k++)
            {
                UnityComplexNumber* h = c.h[k];
                UnityComplexNumber* x = c.x[(k + data->bufferindex) % data->numpartitions];
                for (int n = 0; n < data->fftsize; n++)
                    UnityComplexNumber::MulAdd(h[n], x[n], y[n], y[n]);
            }
            FFT::Backward(y, data->fftsize, false);

            // overlap-save readout
            for (int n = 0; n < data->hopsize; n++)
            {
                float input = inbuffer[n * outchannels + i];
                outbuffer[n * outchannels + i] = input + (gain * y[n].re - input) * wet;
            }
        }

        if (--data->bufferindex < 0)
            data->bufferindex = data->numpartitions - 1;

        data->writeoffset = writeoffset;

        return UNITY_AUDIODSP_OK;
    }